

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# music_midi_timidity.cpp
# Opt level: O0

int __thiscall TimidityPPMIDIDevice::Resume(TimidityPPMIDIDevice *this)

{
  SoundStream *pSVar1;
  bool bVar2;
  uint uVar3;
  TimidityPPMIDIDevice *this_local;
  
  if (((this->super_PseudoMIDIDevice).Started & 1U) != 0) {
    return 0;
  }
  bVar2 = LaunchTimidity(this);
  if (bVar2) {
    if ((this->super_PseudoMIDIDevice).Stream != (SoundStream *)0x0) {
      pSVar1 = (this->super_PseudoMIDIDevice).Stream;
      FFloatCVar::operator_cast_to_float(&timidity_mastervolume);
      uVar3 = (*pSVar1->_vptr_SoundStream[2])(pSVar1,1);
      if ((uVar3 & 1) == 0) goto LAB_0041c794;
    }
    (this->super_PseudoMIDIDevice).Started = true;
    this_local._4_4_ = 0;
  }
  else {
LAB_0041c794:
    this_local._4_4_ = 1;
  }
  return this_local._4_4_;
}

Assistant:

int TimidityPPMIDIDevice::Resume()
{
	if (!Started)
	{
		if (LaunchTimidity())
		{
			// Assume success if not mixing with the sound system
			if (Stream == NULL || Stream->Play(true, timidity_mastervolume))
			{
				Started = true;
				return 0;
			}
		}
		return 1;
	}
	return 0;
}